

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O2

bool WTF::ParseUnscopedName(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  short sVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  State copy;
  
  bVar8 = ParseUnqualifiedName(state);
  bVar10 = true;
  if (!bVar8) {
    pcVar1 = state->mangled_cur;
    pcVar2 = state->out_cur;
    pcVar3 = state->out_begin;
    pcVar4 = state->out_end;
    pcVar5 = state->prev_name;
    iVar6 = state->prev_name_length;
    sVar7 = state->nest_level;
    bVar8 = state->append;
    bVar10 = state->overflowed;
    bVar9 = ParseTwoCharToken(state,"St");
    if (bVar9) {
      MaybeAppend(state,"std::");
      bVar9 = ParseUnqualifiedName(state);
      if (bVar9) {
        return true;
      }
    }
    state->prev_name = pcVar5;
    state->prev_name_length = iVar6;
    state->nest_level = sVar7;
    state->append = bVar8;
    state->overflowed = bVar10;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

static bool ParseUnscopedName(State *state) {
  if (ParseUnqualifiedName(state)) {
    return true;
  }

  State copy = *state;
  if (ParseTwoCharToken(state, "St") &&
      MaybeAppend(state, "std::") &&
      ParseUnqualifiedName(state)) {
    return true;
  }
  *state = copy;
  return false;
}